

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

char * format_telnet_command(SockAddr *addr,int port,Conf *conf,uint *flags_out)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  strbuf *buf_o;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  int port_1;
  char *host;
  char *password;
  char *username;
  char dest [512];
  int local_4c;
  uchar local_45;
  int i;
  uchar v;
  uint flags;
  strbuf *buf;
  int eo;
  int so;
  char *fmt;
  uint *flags_out_local;
  Conf *conf_local;
  int port_local;
  SockAddr *addr_local;
  
  pcVar4 = conf_get_str(conf,0x12);
  buf._4_4_ = 0;
  buf_o = strbuf_new();
  i = 0;
  while (iVar7 = buf._4_4_, buf._0_4_ = buf._4_4_, pcVar4[buf._4_4_] != '\0') {
    while( true ) {
      iVar2 = (int)buf;
      bVar8 = false;
      if ((pcVar4[(int)buf] != '\0') && (bVar8 = false, pcVar4[(int)buf] != '%')) {
        bVar8 = pcVar4[(int)buf] != '\\';
      }
      if (!bVar8) break;
      buf._0_4_ = (int)buf + 1;
    }
    iVar7 = (int)buf;
    if (pcVar4[(int)buf] == '\0') break;
    if ((int)buf != buf._4_4_) {
      BinarySink_put_data(buf_o->binarysink_,pcVar4 + buf._4_4_,(long)((int)buf - buf._4_4_));
    }
    iVar7 = (int)buf + 1;
    buf._4_4_ = (int)buf;
    if (pcVar4[iVar7] == '\0') break;
    if (pcVar4[(int)buf] == '\\') {
      cVar1 = pcVar4[iVar7];
      if (cVar1 == '%') {
        BinarySink_put_byte(buf_o->binarysink_,'%');
        buf._0_4_ = (int)buf + 2;
      }
      else if (cVar1 == 'X') {
LAB_0015a038:
        local_45 = '\0';
        local_4c = 0;
        buf._0_4_ = iVar7;
        while( true ) {
          iVar7 = (int)buf + 1;
          if ((pcVar4[iVar7] < '0') || ('9' < pcVar4[iVar7])) {
            if ((pcVar4[iVar7] < 'a') || ('f' < pcVar4[iVar7])) {
              if ((pcVar4[iVar7] < 'A') || ('F' < pcVar4[iVar7])) {
                BinarySink_put_byte(buf_o->binarysink_,'\\');
                buf._0_4_ = iVar2 + 1;
                goto LAB_0015a4b9;
              }
              cVar1 = pcVar4[iVar7] + -0x37;
            }
            else {
              cVar1 = pcVar4[iVar7] + -0x57;
            }
          }
          else {
            cVar1 = pcVar4[iVar7] + -0x30;
          }
          local_45 = local_45 + cVar1;
          if (local_4c == 1) break;
          local_4c = local_4c + 1;
          local_45 = cVar1 << 4;
          buf._0_4_ = iVar7;
        }
        BinarySink_put_byte(buf_o->binarysink_,local_45);
        buf._0_4_ = (int)buf + 2;
      }
      else if (cVar1 == '\\') {
        BinarySink_put_byte(buf_o->binarysink_,'\\');
        buf._0_4_ = (int)buf + 2;
      }
      else if (cVar1 == 'n') {
        BinarySink_put_byte(buf_o->binarysink_,'\n');
        buf._0_4_ = (int)buf + 2;
      }
      else if (cVar1 == 'r') {
        BinarySink_put_byte(buf_o->binarysink_,'\r');
        buf._0_4_ = (int)buf + 2;
      }
      else if (cVar1 == 't') {
        BinarySink_put_byte(buf_o->binarysink_,'\t');
        buf._0_4_ = (int)buf + 2;
      }
      else {
        if (cVar1 == 'x') goto LAB_0015a038;
        BinarySink_put_data(buf_o->binarysink_,pcVar4 + (int)buf,2);
        buf._0_4_ = (int)buf + 2;
      }
    }
    else if (pcVar4[iVar7] == '%') {
      BinarySink_put_byte(buf_o->binarysink_,'%');
      buf._0_4_ = (int)buf + 2;
    }
    else {
      iVar2 = strncasecmp(pcVar4 + iVar7,"host",4);
      if (iVar2 == 0) {
        sk_getaddr(addr,(char *)&username,0x200);
        sVar5 = strlen((char *)&username);
        BinarySink_put_data(buf_o->binarysink_,&username,sVar5);
        buf._0_4_ = (int)buf + 5;
      }
      else {
        iVar2 = strncasecmp(pcVar4 + iVar7,"port",4);
        if (iVar2 == 0) {
          BinarySink_put_fmt(buf_o->binarysink_,"%d",(ulong)(uint)port);
          buf._0_4_ = (int)buf + 5;
        }
        else {
          iVar2 = strncasecmp(pcVar4 + iVar7,"user",4);
          if (iVar2 == 0) {
            pcVar6 = conf_get_str(conf,0x10);
            sVar5 = strlen(pcVar6);
            BinarySink_put_data(buf_o->binarysink_,pcVar6,sVar5);
            buf._0_4_ = (int)buf + 5;
            if (*pcVar6 == '\0') {
              i = i | 1;
            }
          }
          else {
            iVar2 = strncasecmp(pcVar4 + iVar7,"pass",4);
            if (iVar2 == 0) {
              pcVar6 = conf_get_str(conf,0x11);
              sVar5 = strlen(pcVar6);
              BinarySink_put_data(buf_o->binarysink_,pcVar6,sVar5);
              buf._0_4_ = (int)buf + 5;
              if (*pcVar6 == '\0') {
                i = i | 2;
              }
            }
            else {
              iVar2 = strncasecmp(pcVar4 + iVar7,"proxyhost",9);
              if (iVar2 == 0) {
                pcVar6 = conf_get_str(conf,0xe);
                sVar5 = strlen(pcVar6);
                BinarySink_put_data(buf_o->binarysink_,pcVar6,sVar5);
                buf._0_4_ = (int)buf + 10;
              }
              else {
                iVar2 = strncasecmp(pcVar4 + iVar7,"proxyport",9);
                if (iVar2 == 0) {
                  uVar3 = conf_get_int(conf,0xf);
                  BinarySink_put_fmt(buf_o->binarysink_,"%d",(ulong)uVar3);
                  buf._0_4_ = (int)buf + 10;
                }
                else {
                  BinarySink_put_byte(buf_o->binarysink_,'%');
                  buf._0_4_ = iVar7;
                }
              }
            }
          }
        }
      }
    }
LAB_0015a4b9:
    buf._4_4_ = (int)buf;
  }
  buf._0_4_ = iVar7;
  if ((int)buf != buf._4_4_) {
    BinarySink_put_data(buf_o->binarysink_,pcVar4 + buf._4_4_,(long)((int)buf - buf._4_4_));
  }
  if (flags_out != (uint *)0x0) {
    *flags_out = i;
  }
  pcVar4 = strbuf_to_str(buf_o);
  return pcVar4;
}

Assistant:

char *format_telnet_command(SockAddr *addr, int port, Conf *conf,
                            unsigned *flags_out)
{
    char *fmt = conf_get_str(conf, CONF_proxy_telnet_command);
    int so = 0, eo = 0;
    strbuf *buf = strbuf_new();
    unsigned flags = 0;

    /* we need to escape \\, \%, \r, \n, \t, \x??, \0???,
     * %%, %host, %port, %user, and %pass
     */

    while (fmt[eo] != 0) {

        /* scan forward until we hit end-of-line,
         * or an escape character (\ or %) */
        while (fmt[eo] != 0 && fmt[eo] != '%' && fmt[eo] != '\\')
            eo++;

        /* if we hit eol, break out of our escaping loop */
        if (fmt[eo] == 0) break;

        /* if there was any unescaped text before the escape
         * character, send that now */
        if (eo != so)
            put_data(buf, fmt + so, eo - so);

        so = eo++;

        /* if the escape character was the last character of
         * the line, we'll just stop and send it. */
        if (fmt[eo] == 0) break;

        if (fmt[so] == '\\') {

            /* we recognize \\, \%, \r, \n, \t, \x??.
             * anything else, we just send unescaped (including the \).
             */

            switch (fmt[eo]) {

              case '\\':
                put_byte(buf, '\\');
                eo++;
                break;

              case '%':
                put_byte(buf, '%');
                eo++;
                break;

              case 'r':
                put_byte(buf, '\r');
                eo++;
                break;

              case 'n':
                put_byte(buf, '\n');
                eo++;
                break;

              case 't':
                put_byte(buf, '\t');
                eo++;
                break;

              case 'x':
              case 'X': {
                /* escaped hexadecimal value (ie. \xff) */
                unsigned char v = 0;
                int i = 0;

                for (;;) {
                  eo++;
                  if (fmt[eo] >= '0' && fmt[eo] <= '9')
                      v += fmt[eo] - '0';
                  else if (fmt[eo] >= 'a' && fmt[eo] <= 'f')
                      v += fmt[eo] - 'a' + 10;
                  else if (fmt[eo] >= 'A' && fmt[eo] <= 'F')
                      v += fmt[eo] - 'A' + 10;
                  else {
                    /* non hex character, so we abort and just
                     * send the whole thing unescaped (including \x)
                     */
                    put_byte(buf, '\\');
                    eo = so + 1;
                    break;
                  }

                  /* we only extract two hex characters */
                  if (i == 1) {
                    put_byte(buf, v);
                    eo++;
                    break;
                  }

                  i++;
                  v <<= 4;
                }
                break;
              }

              default:
                put_data(buf, fmt + so, 2);
                eo++;
                break;
            }
        } else {

            /* % escape. we recognize %%, %host, %port, %user, %pass.
             * %proxyhost, %proxyport. Anything else we just send
             * unescaped (including the %).
             */

            if (fmt[eo] == '%') {
                put_byte(buf, '%');
                eo++;
            }
            else if (strnicmp(fmt + eo, "host", 4) == 0) {
                char dest[512];
                sk_getaddr(addr, dest, lenof(dest));
                put_data(buf, dest, strlen(dest));
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "port", 4) == 0) {
                put_fmt(buf, "%d", port);
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "user", 4) == 0) {
                const char *username = conf_get_str(conf, CONF_proxy_username);
                put_data(buf, username, strlen(username));
                eo += 4;
                if (!*username)
                    flags |= TELNET_CMD_MISSING_USERNAME;
            }
            else if (strnicmp(fmt + eo, "pass", 4) == 0) {
                const char *password = conf_get_str(conf, CONF_proxy_password);
                put_data(buf, password, strlen(password));
                eo += 4;
                if (!*password)
                    flags |= TELNET_CMD_MISSING_PASSWORD;
            }
            else if (strnicmp(fmt + eo, "proxyhost", 9) == 0) {
                const char *host = conf_get_str(conf, CONF_proxy_host);
                put_data(buf, host, strlen(host));
                eo += 9;
            }
            else if (strnicmp(fmt + eo, "proxyport", 9) == 0) {
                int port = conf_get_int(conf, CONF_proxy_port);
                put_fmt(buf, "%d", port);
                eo += 9;
            }
            else {
                /* we don't escape this, so send the % now, and
                 * don't advance eo, so that we'll consider the
                 * text immediately following the % as unescaped.
                 */
                put_byte(buf, '%');
            }
        }

        /* resume scanning for additional escapes after this one. */
        so = eo;
    }

    /* if there is any unescaped text at the end of the line, send it */
    if (eo != so) {
        put_data(buf, fmt + so, eo - so);
    }

    if (flags_out)
        *flags_out = flags;
    return strbuf_to_str(buf);
}